

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mi_stat_count_add_mt(mi_stat_count_t *stat,mi_stat_count_t *src)

{
  int64_t *in_RSI;
  int64_t *in_RDI;
  
  if (in_RDI != in_RSI) {
    mi_atomic_void_addi64_relaxed(in_RDI,in_RSI);
    mi_atomic_void_addi64_relaxed(in_RDI + 2,in_RSI + 2);
    mi_atomic_void_addi64_relaxed(in_RDI + 1,in_RSI + 1);
  }
  return;
}

Assistant:

static void mi_stat_count_add_mt(mi_stat_count_t* stat, const mi_stat_count_t* src) {
  if (stat==src) return;
  mi_atomic_void_addi64_relaxed(&stat->total, &src->total); 
  mi_atomic_void_addi64_relaxed(&stat->current, &src->current); 
  // peak scores do really not work across threads .. we just add them
  mi_atomic_void_addi64_relaxed( &stat->peak, &src->peak);
  // or, take the max?
  // mi_atomic_maxi64_relaxed(&stat->peak, src->peak);
}